

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O2

int __thiscall ncnn::BatchNorm::load_model(BatchNorm *this,ModelBin *mb)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  undefined1 in_XMM3 [16];
  undefined1 auVar12 [16];
  Mat local_70;
  
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels,1);
  Mat::operator=(&this->slope_data,&local_70);
  Mat::~Mat(&local_70);
  iVar8 = -100;
  if (((this->slope_data).data != (void *)0x0) &&
     ((long)(this->slope_data).c * (this->slope_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels,1);
    Mat::operator=(&this->mean_data,&local_70);
    Mat::~Mat(&local_70);
    if (((this->mean_data).data != (void *)0x0) &&
       ((long)(this->mean_data).c * (this->mean_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels,1);
      Mat::operator=(&this->var_data,&local_70);
      Mat::~Mat(&local_70);
      if (((this->var_data).data != (void *)0x0) &&
         ((long)(this->var_data).c * (this->var_data).cstep != 0)) {
        (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->channels);
        Mat::operator=(&this->bias_data,&local_70);
        Mat::~Mat(&local_70);
        if (((this->bias_data).data != (void *)0x0) &&
           ((long)(this->bias_data).c * (this->bias_data).cstep != 0)) {
          Mat::create(&this->a_data,this->channels,4,(Allocator *)0x0);
          if (((this->a_data).data != (void *)0x0) &&
             ((long)(this->a_data).c * (this->a_data).cstep != 0)) {
            Mat::create(&this->b_data,this->channels,4,(Allocator *)0x0);
            pvVar1 = (this->b_data).data;
            if ((pvVar1 != (void *)0x0) && ((long)(this->b_data).c * (this->b_data).cstep != 0)) {
              pvVar2 = (this->var_data).data;
              pvVar3 = (this->bias_data).data;
              pvVar4 = (this->slope_data).data;
              pvVar5 = (this->mean_data).data;
              iVar8 = 0;
              uVar7 = (ulong)(uint)this->channels;
              if (this->channels < 1) {
                uVar7 = 0;
              }
              pvVar6 = (this->a_data).data;
              for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
                fVar10 = this->eps + *(float *)((long)pvVar2 + uVar9 * 4);
                auVar12 = rsqrtss(in_XMM3,ZEXT416((uint)fVar10));
                fVar11 = auVar12._0_4_;
                in_XMM3._4_12_ = auVar12._4_12_;
                fVar10 = fVar11 * -0.5 * (fVar10 * fVar11 * fVar11 + -3.0);
                *(float *)((long)pvVar6 + uVar9 * 4) =
                     *(float *)((long)pvVar3 + uVar9 * 4) -
                     *(float *)((long)pvVar5 + uVar9 * 4) * *(float *)((long)pvVar4 + uVar9 * 4) *
                     fVar10;
                in_XMM3._0_4_ = fVar10 * *(float *)((long)pvVar4 + uVar9 * 4);
                *(float *)((long)pvVar1 + uVar9 * 4) = in_XMM3._0_4_;
              }
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int BatchNorm::load_model(const ModelBin& mb)
{
    slope_data = mb.load(channels, 1);
    if (slope_data.empty())
        return -100;

    mean_data = mb.load(channels, 1);
    if (mean_data.empty())
        return -100;

    var_data = mb.load(channels, 1);
    if (var_data.empty())
        return -100;

    bias_data = mb.load(channels, 1);
    if (bias_data.empty())
        return -100;

    a_data.create(channels);
    if (a_data.empty())
        return -100;
    b_data.create(channels);
    if (b_data.empty())
        return -100;

    for (int i = 0; i < channels; i++)
    {
        float sqrt_var = static_cast<float>(sqrt(var_data[i] + eps));
        a_data[i] = bias_data[i] - slope_data[i] * mean_data[i] / sqrt_var;
        b_data[i] = slope_data[i] / sqrt_var;
    }

    return 0;
}